

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaNotationPtr
xmlSchemaParseNotation(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  int iVar1;
  xmlChar *name_00;
  xmlSchemaAnnotPtr pxVar2;
  xmlNodePtr local_40;
  xmlNodePtr child;
  xmlSchemaNotationPtr ret;
  xmlChar *name;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    name_00 = xmlSchemaGetProp(ctxt,node,"name");
    if (name_00 == (xmlChar *)0x0) {
      xmlSchemaPErr2(ctxt,node,(xmlNodePtr)0x0,0x6bb,"Notation has no name\n",(xmlChar *)0x0,
                     (xmlChar *)0x0);
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlSchemaParserCtxtPtr)
                   xmlSchemaAddNotation(ctxt,schema,name_00,ctxt->targetNamespace,node);
      if (ctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
        ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
      }
      else {
        xmlSchemaPValAttrID(ctxt,node,"id");
        local_40 = node->children;
        if (((local_40 != (xmlNodePtr)0x0) && (local_40->ns != (xmlNs *)0x0)) &&
           ((iVar1 = xmlStrEqual(local_40->name,(xmlChar *)"annotation"), iVar1 != 0 &&
            (iVar1 = xmlStrEqual(local_40->ns->href,xmlSchemaNs), iVar1 != 0)))) {
          pxVar2 = xmlSchemaParseAnnotation(ctxt,local_40,1);
          ctxt_local->error = (xmlSchemaValidityErrorFunc)pxVar2;
          local_40 = local_40->next;
        }
        if (local_40 != (xmlNodePtr)0x0) {
          xmlSchemaPContentErr
                    (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)0x0,node,local_40,
                     (char *)0x0,"(annotation?)");
        }
      }
    }
  }
  return (xmlSchemaNotationPtr)ctxt_local;
}

Assistant:

static xmlSchemaNotationPtr
xmlSchemaParseNotation(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                       xmlNodePtr node)
{
    const xmlChar *name;
    xmlSchemaNotationPtr ret;
    xmlNodePtr child = NULL;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);
    name = xmlSchemaGetProp(ctxt, node, "name");
    if (name == NULL) {
        xmlSchemaPErr2(ctxt, node, child, XML_SCHEMAP_NOTATION_NO_NAME,
                       "Notation has no name\n", NULL, NULL);
        return (NULL);
    }
    ret = xmlSchemaAddNotation(ctxt, schema, name,
	ctxt->targetNamespace, node);
    if (ret == NULL)
        return (NULL);
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");

    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        ret->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child,
	    NULL, "(annotation?)");
    }

    return (ret);
}